

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cc
# Opt level: O3

string * __thiscall
google::protobuf::util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Message *message)

{
  pointer pcVar1;
  undefined8 uVar2;
  long *plVar3;
  long lVar4;
  string *psVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"type.googleapis.com","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_68);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_38 = *plVar6;
    uStack_30 = (undefined4)plVar3[3];
    uStack_2c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar6;
    local_48 = (long *)*plVar3;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  lVar4 = (**(code **)(*(long *)this + 0x98))(this);
  psVar5 = (string *)std::__cxx11::string::_M_append((char *)&local_48,**(ulong **)(lVar4 + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  paVar7 = &psVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar7) {
    uVar2 = *(undefined8 *)((long)&psVar5->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = psVar5->_M_string_length;
  (psVar5->_M_dataplus)._M_p = (pointer)paVar7;
  psVar5->_M_string_length = 0;
  (psVar5->field_2)._M_local_buf[0] = '\0';
  if (local_48 != &local_38) {
    operator_delete(local_48);
    psVar5 = extraout_RAX;
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
    psVar5 = extraout_RAX_00;
  }
  return psVar5;
}

Assistant:

std::string GetTypeUrl(const Message& message) {
  return std::string(kTypeUrlPrefix) + "/" +
         message.GetDescriptor()->full_name();
}